

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dos_blocker.cpp
# Opt level: O0

void __thiscall libtorrent::dht::dos_blocker::dos_blocker(dos_blocker *this)

{
  time_point tVar1;
  node_ban_entry *local_40;
  node_ban_entry *e;
  node_ban_entry *__end2;
  node_ban_entry *__begin2;
  node_ban_entry (*__range2) [20];
  dos_blocker *this_local;
  
  this->m_message_rate_limit = 5;
  this->m_block_timeout = 300;
  local_40 = this->m_ban_nodes;
  do {
    node_ban_entry::node_ban_entry(local_40);
    local_40 = local_40 + 1;
  } while ((dos_blocker *)local_40 != this + 1);
  for (__end2 = this->m_ban_nodes; (dos_blocker *)__end2 != this + 1; __end2 = __end2 + 1) {
    __end2->count = 0;
    tVar1 = min_time();
    (__end2->limit).__d.__r = (rep)tVar1.__d.__r;
  }
  return;
}

Assistant:

dos_blocker::dos_blocker()
		: m_message_rate_limit(5)
		, m_block_timeout(5 * 60)
	{
		for (auto& e : m_ban_nodes)
		{
			e.count = 0;
			e.limit = min_time();
		}
	}